

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveDefineArea(Parser *parser,int flags)

{
  bool bVar1;
  pointer pCVar2;
  reference pvVar3;
  size_type sVar4;
  byte in_DL;
  undefined4 in_register_00000034;
  unique_ptr<CDirectiveArea,_std::default_delete<CDirectiveArea>_> local_58;
  __single_object area;
  bool shared;
  undefined1 local_38 [8];
  vector<Expression,_std::allocator<Expression>_> parameters;
  int flags_local;
  Parser *parser_local;
  
  parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = in_DL;
  std::vector<Expression,_std::allocator<Expression>_>::vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_38);
  bVar1 = Parser::parseExpressionList
                    ((Parser *)CONCAT44(in_register_00000034,flags),
                     (vector<Expression,_std::allocator<Expression>_> *)local_38,2,3);
  if (bVar1) {
    area._M_t.super___uniq_ptr_impl<CDirectiveArea,_std::default_delete<CDirectiveArea>_>._M_t.
    super__Tuple_impl<0UL,_CDirectiveArea_*,_std::default_delete<CDirectiveArea>_>.
    super__Head_base<0UL,_CDirectiveArea_*,_false>._M_head_impl._7_1_ =
         parameters.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_1_ & 1;
    std::vector<Expression,_std::allocator<Expression>_>::operator[]
              ((vector<Expression,_std::allocator<Expression>_> *)local_38,1);
    std::make_unique<CDirectiveArea,bool&,Expression&>
              ((bool *)&local_58,
               (Expression *)
               ((long)&area._M_t.
                       super___uniq_ptr_impl<CDirectiveArea,_std::default_delete<CDirectiveArea>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_CDirectiveArea_*,_std::default_delete<CDirectiveArea>_>
                       .super__Head_base<0UL,_CDirectiveArea_*,_false>._M_head_impl + 7));
    pCVar2 = std::unique_ptr<CDirectiveArea,_std::default_delete<CDirectiveArea>_>::operator->
                       (&local_58);
    pvVar3 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                       ((vector<Expression,_std::allocator<Expression>_> *)local_38,0);
    CDirectiveArea::setPositionExpression(pCVar2,pvVar3);
    sVar4 = std::vector<Expression,_std::allocator<Expression>_>::size
                      ((vector<Expression,_std::allocator<Expression>_> *)local_38);
    if (sVar4 == 3) {
      pCVar2 = std::unique_ptr<CDirectiveArea,_std::default_delete<CDirectiveArea>_>::operator->
                         (&local_58);
      pvVar3 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                         ((vector<Expression,_std::allocator<Expression>_> *)local_38,2);
      CDirectiveArea::setFillExpression(pCVar2,pvVar3);
    }
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<CDirectiveArea,std::default_delete<CDirectiveArea>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               &local_58);
    std::unique_ptr<CDirectiveArea,_std::default_delete<CDirectiveArea>_>::~unique_ptr(&local_58);
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_38);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveDefineArea(Parser& parser, int flags)
{
	std::vector<Expression> parameters;
	if (!parser.parseExpressionList(parameters,2,3))
		return nullptr;

	bool shared = (flags & DIRECTIVE_AREA_SHARED) != 0;
	auto area = std::make_unique<CDirectiveArea>(shared, parameters[1]);
	area->setPositionExpression(parameters[0]);
	if (parameters.size() == 3)
		area->setFillExpression(parameters[2]);

	return area;
}